

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::ClearDirectedEnergyRecords(Directed_Energy_Fire_PDU *this)

{
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vDeRec);
  this->m_ui16NumDERecs = 0;
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  return;
}

Assistant:

void Directed_Energy_Fire_PDU::ClearDirectedEnergyRecords()
{
    m_vDeRec.clear();
    m_ui16NumDERecs = 0;
    m_ui16PDULength = DIRECTED_ENERGY_PDU_SIZE;
}